

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall pzgeom::TPZArc3D::TPZArc3D(TPZArc3D *this,TPZArc3D *cp,TPZGeoMesh *param_3)

{
  long in_RSI;
  TPZManVector<double,_3> *in_RDI;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffff98;
  TPZNodeRep<3,_pztopology::TPZLine> *in_stack_ffffffffffffffa0;
  TPZFNMatrix<9,_double> *this_00;
  void **in_stack_ffffffffffffffa8;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffffb0;
  TPZManVector<double,_3> *this_01;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZArc3D>((TPZRegisterClassId *)in_RDI,0x21);
  TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
            ((TPZNodeRep<3,_pztopology::TPZLine> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  (in_RDI->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)&PTR__TPZArc3D_0246dcf8;
  this_01 = (TPZManVector<double,_3> *)in_RDI->fExtAlloc;
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_ffffffffffffffb0);
  TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)in_RDI[4].fExtAlloc);
  TPZManVector<double,_3>::TPZManVector(this_01,(int64_t)in_RDI);
  this_00 = (TPZFNMatrix<9,_double> *)in_RDI[9].fExtAlloc;
  TPZManVector<double,_3>::TPZManVector(this_01,(int64_t)in_RDI);
  TPZFNMatrix<9,_double>::operator=(this_00,in_stack_ffffffffffffff98);
  TPZFNMatrix<9,_double>::operator=(this_00,in_stack_ffffffffffffff98);
  TPZManVector<double,_3>::operator=(this_01,in_RDI);
  TPZManVector<double,_3>::operator=(this_01,in_RDI);
  in_RDI[10].fExtAlloc[1] = *(double *)(in_RSI + 600);
  in_RDI[10].fExtAlloc[0] = *(double *)(in_RSI + 0x250);
  in_RDI[10].fExtAlloc[2] = *(double *)(in_RSI + 0x260);
  in_RDI[0xb].super_TPZVec<double>._vptr_TPZVec = *(_func_int ***)(in_RSI + 0x268);
  return;
}

Assistant:

TPZArc3D(const TPZArc3D &cp, TPZGeoMesh &) : TPZRegisterClassId(&TPZArc3D::ClassId),
        pzgeom::TPZNodeRep<NNodes, pztopology::TPZLine>(cp){
			this->fICnBase  = cp.fICnBase;
			this->fIBaseCn  = cp.fIBaseCn;
			this->fCenter3D = cp.fCenter3D;
            this->finitialVector = cp.finitialVector;
			this->fRadius   = cp.fRadius;
            this->fAngle = cp.fAngle;
            this->fXcenter = cp.fXcenter;
            this->fYcenter = cp.fYcenter;
		}